

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  allocator<tcu::Vector<float,_4>_> *this_00;
  GLuint GVar1;
  value_type vVar2;
  GLenum GVar3;
  int iVar4;
  int iVar5;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  uint heightRef;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  long lVar9;
  float local_7d0;
  DILogger local_750;
  allocator<tcu::Vector<float,_4>_> local_5c9;
  Vector<float,_4> local_5c8;
  undefined1 local_5b8 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_598;
  undefined1 local_588 [8];
  CColorArray bufferRef;
  undefined8 local_3f0;
  TWrongStructure indirectElements2;
  undefined1 local_268 [8];
  DIResult result;
  size_t i;
  undefined1 local_d0 [8];
  CElementArray elements;
  DrawArraysIndirectCommand indirectElements;
  CColorArray coords;
  allocator<char> local_59;
  string local_58;
  string local_38;
  CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::GL> *local_18;
  CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  local_18 = this;
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar1 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_38,&local_58,
                     (string *)
                     &coords.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
  this->_program = GVar1;
  std::__cxx11::string::~string
            ((string *)
             &coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->_program == 0) {
    this_local = (CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::GL> *)
                 &DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &indirectElements.first);
    DrawIndirectBase::PrimitiveGen
              (&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&indirectElements.first);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_buffer);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indirectElements.first);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        &indirectElements.first,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar6 << 4,pvVar7,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indirectElements.count = 0;
    indirectElements.primCount = 0;
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indirectElements.first);
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(1,(int)sVar6);
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indirectElements.first);
    i._4_4_ = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,sVar6,
               (value_type_conflict4 *)((long)&i + 4),(allocator<unsigned_int> *)((long)&i + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 3));
    for (result.status_ = 0; lVar9 = result.status_,
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0),
        (ulong)lVar9 < sVar6; result.status_ = result.status_ + 1) {
      vVar2 = (value_type)result.status_;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,
                          result.status_);
      *pvVar8 = vVar2;
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x10,
               &elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0x88e4);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,this->_ebo);
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8893,sVar6 << 2,pvVar8,0x88e4);
    DIResult::DIResult((DIResult *)local_268);
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x502) {
      DIResult::error((DILogger *)&indirectElements2,(DIResult *)local_268);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&indirectElements2,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)&indirectElements2);
    }
    local_3f0 = 0;
    sVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       &indirectElements.first);
    local_7d0 = (float)sVar6;
    local_3f0 = CONCAT44(1,local_7d0);
    glu::CallLogWrapper::glDeleteBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,8,&local_3f0,0x88e4);
    glu::CallLogWrapper::glDrawElementsIndirect
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,4,0x1405,(void *)0x0);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 != 0x502) {
      DIResult::error((DILogger *)
                      &bufferRef.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(DIResult *)local_268);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)
                 &bufferRef.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)
                          &bufferRef.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    iVar4 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_598,0.0);
    this_00 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&bufferTest.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_588,
               (long)(iVar4 * iVar5),&local_598,this_00);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar4 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_5c8,1.0);
    std::allocator<tcu::Vector<float,_4>_>::allocator(&local_5c9);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_5b8,
               (long)(iVar4 * iVar5),&local_5c8,&local_5c9);
    std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_5c9);
    iVar4 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar5 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    pvVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_5b8,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar4,iVar5,pvVar7);
    widthTest = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightTest = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    widthRef = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightRef = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_5b8,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_588,widthRef,heightRef);
    DIResult::sub_result(&local_750,(DIResult *)local_268,lVar9);
    DILogger::~DILogger(&local_750);
    this_local = (CNegativeInvalidSizeElements<glcts::(anonymous_namespace)::test_api::GL> *)
                 DIResult::code((DIResult *)local_268);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_5b8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_588);
    DIResult::~DIResult((DIResult *)local_268);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &indirectElements.first);
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand indirectElements = { 0, 0, 0, 0 };
		indirectElements.count					   = static_cast<GLuint>(coords.size());
		indirectElements.primCount				   = 1;

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		DIResult result;

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		TWrongStructure indirectElements2 = { 0, 0 };
		indirectElements2.count			  = static_cast<GLfloat>(coords.size());
		indirectElements2.primCount		  = 1;

		glDeleteBuffers(1, &_bufferIndirect);
		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(TWrongStructure), &indirectElements2, GL_STATIC_DRAW);

		glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}